

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.h
# Opt level: O2

EncodingResult<kj::String> *
kj::decodeUriComponent(EncodingResult<kj::String> *__return_storage_ptr__,ArrayPtr<const_char> text)

{
  size_t sVar1;
  uchar *puVar2;
  DecodeUriOptions in_R8W;
  ArrayPtr<const_char> text_00;
  EncodingResult<kj::Array<unsigned_char>_> result;
  Array<char> result_1;
  Array<char> local_38;
  
  text_00.ptr = (char *)text.size_;
  text_00.size_ = 1;
  decodeBinaryUriComponent(&result,(kj *)text.ptr,text_00,in_R8W);
  sVar1 = result.super_Array<unsigned_char>.size_;
  puVar2 = result.super_Array<unsigned_char>.ptr;
  if (result.super_Array<unsigned_char>.disposer == (ArrayDisposer *)0x0) {
    result_1.disposer = (ArrayDisposer *)0x0;
    sVar1 = 0;
    puVar2 = (uchar *)0x0;
  }
  else {
    result_1.disposer = result.super_Array<unsigned_char>.disposer;
    result.super_Array<unsigned_char>.ptr = (uchar *)0x0;
    result.super_Array<unsigned_char>.size_ = 0;
  }
  local_38.disposer = result.super_Array<unsigned_char>.disposer;
  result_1.ptr = (char *)0x0;
  result_1.size_ = 0;
  (__return_storage_ptr__->super_String).content.ptr = (char *)puVar2;
  (__return_storage_ptr__->super_String).content.size_ = sVar1;
  (__return_storage_ptr__->super_String).content.disposer =
       result.super_Array<unsigned_char>.disposer;
  local_38.ptr = (char *)0x0;
  local_38.size_ = 0;
  __return_storage_ptr__->hadErrors = result.hadErrors;
  Array<char>::~Array(&local_38);
  Array<char>::~Array(&result_1);
  Array<unsigned_char>::~Array(&result.super_Array<unsigned_char>);
  return __return_storage_ptr__;
}

Assistant:

inline EncodingResult<String> decodeUriComponent(ArrayPtr<const char> text) {
  auto result = decodeBinaryUriComponent(text, DecodeUriOptions { /*.nulTerminate=*/true });
  return { String(result.releaseAsChars()), result.hadErrors };
}